

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_rfc5444.c
# Opt level: O2

oonf_rfc5444_protocol * oonf_rfc5444_add_protocol(char *name,_Bool fixed_local_port)

{
  avl_node *paVar1;
  oonf_rfc5444_protocol *dest;
  long lVar2;
  rfc5444_reader *prVar3;
  rfc5444_reader *prVar4;
  byte bVar5;
  
  bVar5 = 0;
  paVar1 = avl_find(&_protocol_tree,name);
  if (paVar1 == (avl_node *)0x0) {
    dest = (oonf_rfc5444_protocol *)oonf_class_malloc(&_protocol_memcookie);
    if (dest == (oonf_rfc5444_protocol *)0x0) {
      return (oonf_rfc5444_protocol *)0x0;
    }
    strscpy((char *)dest,name,0x20);
    dest->fixed_local_port = fixed_local_port;
    (dest->_node).key = dest;
    avl_insert(&_protocol_tree,&dest->_node);
    prVar3 = &_reader_template;
    prVar4 = &dest->reader;
    for (lVar2 = 0xf; lVar2 != 0; lVar2 = lVar2 + -1) {
      (prVar4->packet_consumer).list_head.next = (prVar3->packet_consumer).list_head.next;
      prVar3 = (rfc5444_reader *)((long)prVar3 + ((ulong)bVar5 * -2 + 1) * 8);
      prVar4 = (rfc5444_reader *)((long)prVar4 + (ulong)bVar5 * -0x10 + 8);
    }
    memcpy(&dest->writer,&_writer_template,0x140);
    (dest->writer).msg_buffer = dest->_msg_buffer;
    (dest->writer).addrtlv_buffer = dest->_addrtlv_buffer;
    rfc5444_reader_init(&dest->reader);
    rfc5444_writer_init(&dest->writer);
    (dest->writer).message_generation_notifier = _cb_msggen_notifier;
    oonf_duplicate_set_add(&dest->forwarded_set,OONF_DUPSET_16BIT);
    oonf_duplicate_set_add(&dest->processed_set,OONF_DUPSET_16BIT);
    avl_init(&dest->_interface_tree,avl_comp_strcasecmp,false);
  }
  else {
    dest = (oonf_rfc5444_protocol *)&paVar1[-0xc].right;
  }
  if ((log_global_mask[_oonf_rfc5444_subsystem.logging] & 2) != 0) {
    oonf_log(LOG_SEVERITY_INFO,_oonf_rfc5444_subsystem.logging,"src/base/oonf_rfc5444.c",0x1d7,
             (void *)0x0,0,"Add protocol %s (refcount was %d)",name,(ulong)(uint)dest->_refcount);
  }
  dest->_refcount = dest->_refcount + 1;
  return dest;
}

Assistant:

struct oonf_rfc5444_protocol *
oonf_rfc5444_add_protocol(const char *name, bool fixed_local_port) {
  struct oonf_rfc5444_protocol *protocol;

  protocol = avl_find_element(&_protocol_tree, name, protocol, _node);
  if (!protocol) {
    protocol = oonf_class_malloc(&_protocol_memcookie);
    if (protocol == NULL) {
      return NULL;
    }

    /* set name */
    strscpy(protocol->name, name, sizeof(protocol->name));
    protocol->fixed_local_port = fixed_local_port;

    /* hook into global protocol tree */
    protocol->_node.key = protocol->name;
    avl_insert(&_protocol_tree, &protocol->_node);

    /* initialize rfc5444 reader/writer */
    memcpy(&protocol->reader, &_reader_template, sizeof(_reader_template));
    memcpy(&protocol->writer, &_writer_template, sizeof(_writer_template));
    protocol->writer.msg_buffer = protocol->_msg_buffer;
    protocol->writer.addrtlv_buffer = protocol->_addrtlv_buffer;
    rfc5444_reader_init(&protocol->reader);
    rfc5444_writer_init(&protocol->writer);

    protocol->writer.message_generation_notifier = _cb_msggen_notifier;

    /* initialize processing and forwarding set */
    oonf_duplicate_set_add(&protocol->forwarded_set, OONF_DUPSET_16BIT);
    oonf_duplicate_set_add(&protocol->processed_set, OONF_DUPSET_16BIT);

    /* init interface subtree */
    avl_init(&protocol->_interface_tree, avl_comp_strcasecmp, false);
  }

  OONF_INFO(LOG_RFC5444, "Add protocol %s (refcount was %d)", name, protocol->_refcount);

  /* keep track of reference count */
  protocol->_refcount++;

  return protocol;
}